

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

bool __thiscall MatchTool::match(MatchTool *this,char *txt)

{
  bool bVar1;
  reference this_00;
  reference pvVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  int *local_40;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  int local_28;
  int local_24;
  int i;
  int curr;
  char *txt_local;
  MatchTool *this_local;
  
  local_24 = 1;
  local_28 = 0;
  _i = txt;
  txt_local = (char *)this;
  while( true ) {
    if (_i[local_28] == '\0') {
      local_38._M_current = (int *)std::vector<int,_std::allocator<int>_>::cbegin(&this->targets);
      local_40 = (int *)std::vector<int,_std::allocator<int>_>::cend(&this->targets);
      local_30 = std::
                 find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                           (local_38,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                      )local_40,&local_24);
      local_48._M_current = (int *)std::vector<int,_std::allocator<int>_>::cend(&this->targets);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_48);
      return bVar1;
    }
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&this->dtran,(long)local_24);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)_i[local_28]);
    local_24 = *pvVar2;
    if (local_24 == 0) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool MatchTool::match(const char *txt) {
    int curr = 1;
    for (int i = 0; txt[i] != '\0'; i++) {
        curr = dtran[curr][(unsigned long)txt[i]];
        if (curr == 0) return false;
    }
    return std::find(targets.cbegin(), targets.cend(), curr) != targets.cend();
}